

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

StringRef __thiscall
Catch::Generators::GeneratorUntypedBase::currentElementAsString(GeneratorUntypedBase *this)

{
  StringRef SVar1;
  long *local_38 [2];
  long local_28 [2];
  
  if ((this->m_stringReprCache)._M_string_length == 0) {
    (*this->_vptr_GeneratorUntypedBase[1])(local_38,this);
    std::__cxx11::string::operator=((string *)&this->m_stringReprCache,(string *)local_38);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
  }
  SVar1.m_start = (this->m_stringReprCache)._M_dataplus._M_p;
  SVar1.m_size = (this->m_stringReprCache)._M_string_length;
  return SVar1;
}

Assistant:

StringRef GeneratorUntypedBase::currentElementAsString() const {
            if ( m_stringReprCache.empty() ) {
                m_stringReprCache = stringifyImpl();
            }
            return m_stringReprCache;
        }